

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>_> *
__thiscall
kj::_::
ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>_>::
operator=(ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>_>
          *this,ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>_>
                *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>_>::
  operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;